

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O3

Option * __thiscall CLI::Option::requires<CLI::App>(Option *this,string *opt_name)

{
  pointer puVar1;
  pointer pcVar2;
  bool bVar3;
  IncorrectConstruction *__return_storage_ptr__;
  Option *pOVar4;
  pointer puVar5;
  string local_70;
  string local_50;
  
  puVar5 = (this->parent_->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->parent_->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar5 != puVar1) {
    do {
      pOVar4 = (puVar5->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
               _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
               super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      if (pOVar4 != this) {
        pcVar2 = (opt_name->_M_dataplus)._M_p;
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,pcVar2,pcVar2 + opt_name->_M_string_length);
        bVar3 = check_name(pOVar4,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        if (bVar3) {
          pOVar4 = requires(this,(puVar5->_M_t).
                                 super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>
                                 .super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
          return pOVar4;
        }
      }
      puVar5 = puVar5 + 1;
    } while (puVar5 != puVar1);
  }
  __return_storage_ptr__ = (IncorrectConstruction *)__cxa_allocate_exception(0x38);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  pcVar2 = (opt_name->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + opt_name->_M_string_length);
  IncorrectConstruction::MissingOption(__return_storage_ptr__,&local_50);
  __cxa_throw(__return_storage_ptr__,&IncorrectConstruction::typeinfo,Error::~Error);
}

Assistant:

Option *requires(std::string opt_name) {
        for(const Option_p &opt : dynamic_cast<T *>(parent_)->options_)
            if(opt.get() != this && opt->check_name(opt_name))
                return requires(opt.get());
        throw IncorrectConstruction::MissingOption(opt_name);
    }